

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * Cudd_addApply(DdManager *dd,DD_AOP op,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddAddApplyRecur(dd,op,f,g);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addApply(
  DdManager * dd,
  DD_AOP op,
  DdNode * f,
  DdNode * g)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddAddApplyRecur(dd,op,f,g);
    } while (dd->reordered == 1);
    return(res);

}